

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMLSParserImpl::error
          (DOMLSParserImpl *this,uint code,XMLCh *param_2,ErrTypes errType,XMLCh *errorText,
          XMLCh *systemId,XMLCh *param_6,XMLFileLoc lineNum,XMLFileLoc colNum)

{
  XMLScanner *pXVar1;
  XMLReader *this_00;
  char cVar2;
  uint *puVar3;
  ErrorSeverity severity;
  DOMErrorImpl domError;
  DOMLocatorImpl local_88;
  DOMErrorImpl local_50;
  
  if (this->fErrorHandler != (DOMErrorHandler *)0x0) {
    severity = DOM_SEVERITY_WARNING;
    if (errType != ErrType_Warning) {
      severity = errType == ErrType_Fatal | DOM_SEVERITY_ERROR;
    }
    DOMLocatorImpl::DOMLocatorImpl
              (&local_88,lineNum,colNum,(this->super_AbstractDOMParser).fCurrentNode,systemId,
               0xffffffffffffffff,0xffffffffffffffff);
    pXVar1 = (this->super_AbstractDOMParser).fScanner;
    if (pXVar1->fCalculateSrcOfs == true) {
      this_00 = (pXVar1->fReaderMgr).fCurReader;
      if (this_00 == (XMLReader *)0x0) {
        local_88.fByteOffset = 0;
      }
      else {
        local_88.fByteOffset = XMLReader::getSrcOffset(this_00);
      }
    }
    DOMErrorImpl::DOMErrorImpl(&local_50,severity,errorText,&local_88.super_DOMLocator);
    cVar2 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,&local_50);
    if ((cVar2 == '\0') && (((this->super_AbstractDOMParser).fScanner)->fInException == false)) {
      puVar3 = (uint *)__cxa_allocate_exception(4);
      *puVar3 = code;
      __cxa_throw(puVar3,&XMLErrs::Codes::typeinfo,0);
    }
    DOMErrorImpl::~DOMErrorImpl(&local_50);
    DOMLocatorImpl::~DOMLocatorImpl(&local_88);
  }
  return;
}

Assistant:

void DOMLSParserImpl::error( const   unsigned int                code
                            , const XMLCh* const
                            , const XMLErrorReporter::ErrTypes  errType
                            , const XMLCh* const                errorText
                            , const XMLCh* const                systemId
                            , const XMLCh* const
                            , const XMLFileLoc                  lineNum
                            , const XMLFileLoc                  colNum)
{
    if (fErrorHandler) {

        DOMError::ErrorSeverity severity = DOMError::DOM_SEVERITY_ERROR;

        if (errType == XMLErrorReporter::ErrType_Warning)
            severity = DOMError::DOM_SEVERITY_WARNING;
        else if (errType == XMLErrorReporter::ErrType_Fatal)
            severity = DOMError::DOM_SEVERITY_FATAL_ERROR;

        DOMLocatorImpl location(lineNum, colNum, getCurrentNode(), systemId);
        if(getScanner()->getCalculateSrcOfs())
            location.setByteOffset(getScanner()->getSrcOffset());
        DOMErrorImpl domError(severity, errorText, &location);

        // if user return false, we should stop the process, so throw an error
        bool toContinueProcess = true;
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
        if (!toContinueProcess && !getScanner()->getInException())
            throw (XMLErrs::Codes) code;
    }
}